

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O2

Value * xmrig::Json::getArray(Value *obj,char *key)

{
  ConstMemberIterator CVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar2;
  
  CVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::FindMember(obj,key);
  if (CVar1.ptr_ ==
      (Pointer)((ulong)(obj->data_).s.length * 0x20 + ((ulong)(obj->data_).s.str & 0xffffffffffff)))
  {
    pGVar2 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)kNullValue;
  }
  else {
    pGVar2 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)kNullValue;
    if (((CVar1.ptr_)->value).data_.f.flags == 4) {
      pGVar2 = &(CVar1.ptr_)->value;
    }
  }
  return pGVar2;
}

Assistant:

const rapidjson::Value &xmrig::Json::getArray(const rapidjson::Value &obj, const char *key)
{
    assert(obj.IsObject());

    auto i = obj.FindMember(key);
    if (i != obj.MemberEnd() && i->value.IsArray()) {
        return i->value;
    }

    return kNullValue;
}